

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::operator*(mat3 *__return_storage_ptr__,mat3 *a,mat3 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  mat3 *pmVar4;
  int j;
  long lVar5;
  long lVar6;
  float_t *pfVar7;
  float afStack_30 [2];
  mat3 t;
  
  pmVar4 = __return_storage_ptr__;
  t.m[0].y = b->m[1].x;
  t.m[0].x = b->m[0].x;
  t.m[1].x = b->m[0].y;
  t.m[0].z = b->m[2].x;
  t.m[1].z = b->m[2].y;
  t.m[1].y = b->m[1].y;
  t.m[2].y = b->m[1].z;
  t.m[2].x = b->m[0].z;
  t.m[2].z = b->m[2].z;
  __return_storage_ptr__->m[0].x = 1.0;
  __return_storage_ptr__->m[0].y = 0.0;
  *(undefined8 *)&__return_storage_ptr__->m[0].z = 0;
  __return_storage_ptr__->m[1].y = 1.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 1.0;
  lVar5 = 0;
  do {
    fVar1 = a->m[lVar5].x;
    fVar2 = a->m[lVar5].y;
    fVar3 = a->m[lVar5].z;
    lVar6 = 2;
    pfVar7 = (float_t *)__return_storage_ptr__;
    do {
      *pfVar7 = (&t.m[0].x)[lVar6] * fVar3 +
                afStack_30[lVar6] * fVar1 + afStack_30[lVar6 + 1] * fVar2;
      pfVar7 = pfVar7 + 1;
      lVar6 = lVar6 + 3;
    } while (lVar6 != 0xb);
    lVar5 = lVar5 + 1;
    __return_storage_ptr__ = (mat3 *)((long)__return_storage_ptr__ + 0xc);
  } while (lVar5 != 3);
  return pmVar4;
}

Assistant:

mat3 operator*(const mat3& a, const mat3& b)
{
    mat3 t = transpose(b), r;

    for (int j = 0; j < 3; ++j)
    for (int i = 0; i < 3; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}